

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  uint8_t uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  size_t *local_128;
  ulong local_118;
  ulong local_100;
  ulong local_e8;
  ulong auStack_58 [5];
  
  uVar4 = (position - 7) + num_bytes;
  sVar33 = position;
  if (7 < num_bytes) {
    sVar33 = uVar4;
  }
  lVar34 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar34 = 0x40;
  }
  uVar38 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_128 = last_insert_len;
LAB_0010413a:
    *(ulong *)dist_cache = (uVar38 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_128 - (long)last_insert_len >> 4);
    return;
  }
  uVar41 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar5 = *(long *)(literal_context_lut + 0x10);
  local_100 = lVar34 + position;
  lVar6 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar8 = (uint)ringbuffer_mask;
  lVar3 = position - 1;
  local_128 = last_insert_len;
  uVar40 = position;
LAB_001031ac:
  uVar35 = uVar1 - uVar40;
  uVar21 = uVar41;
  if (uVar40 < uVar41) {
    uVar21 = uVar40;
  }
  uVar19 = lVar5 + uVar40;
  if (uVar41 <= lVar5 + uVar40) {
    uVar19 = uVar41;
  }
  uVar14 = uVar40 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar14);
  uVar9 = ringbuffer[uVar14];
  local_140 = (ulong)*(int *)&(hasher->common).extra;
  local_e8 = 0x7e4;
  if ((uVar40 - local_140 < uVar40) &&
     (uVar17 = (ulong)((uint)(uVar40 - local_140) & uVar8), uVar9 == ringbuffer[uVar17])) {
    if (7 < uVar35) {
      uVar36 = uVar35 & 0xfffffffffffffff8;
      piVar15 = (int *)(ringbuffer + uVar36 + uVar14);
      lVar26 = 0;
      uVar37 = 0;
LAB_00103242:
      if (*(ulong *)(piVar2 + uVar37 * 2) == *(ulong *)(ringbuffer + uVar37 * 8 + uVar17))
      goto code_r0x00103253;
      uVar37 = *(ulong *)(ringbuffer + uVar37 * 8 + uVar17) ^ *(ulong *)(piVar2 + uVar37 * 2);
      uVar17 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      uVar37 = (uVar17 >> 3 & 0x1fffffff) - lVar26;
      goto LAB_001034b7;
    }
    uVar36 = 0;
    piVar15 = piVar2;
LAB_001040c2:
    uVar28 = uVar35 & 7;
    uVar37 = uVar36;
    if (uVar28 != 0) {
      uVar32 = uVar36 | uVar28;
      do {
        uVar37 = uVar36;
        if (ringbuffer[uVar36 + uVar17] != (uint8_t)*piVar15) break;
        piVar15 = (int *)((long)piVar15 + 1);
        uVar36 = uVar36 + 1;
        uVar28 = uVar28 - 1;
        uVar37 = uVar32;
      } while (uVar28 != 0);
    }
LAB_001034b7:
    if ((uVar37 < 4) || (uVar17 = uVar37 * 0x87 + 0x78f, uVar17 < 0x7e5)) {
      local_140 = 0;
      uVar37 = 0;
    }
    else {
      uVar9 = *(uint8_t *)((long)piVar2 + uVar37);
      local_e8 = uVar17;
    }
  }
  else {
    local_140 = 0;
    uVar37 = 0;
  }
  uVar17 = *(ulong *)(literal_context_lut + 0x50);
  uVar25 = (uint)((ulong)(*(long *)(ringbuffer + uVar14) * -0x42e1ca5843000000) >> 0x2f);
  lVar16 = 0;
  lVar26 = 0;
  lVar42 = 1;
  do {
    auStack_58[lVar16] = lVar26 * 8 + (ulong)uVar25 & 0x1ffff;
    auStack_58[lVar16 + 1] = lVar42 * 8 + (ulong)uVar25 & 0x1ffff;
    lVar16 = lVar16 + 2;
    lVar26 = lVar26 + 2;
    lVar42 = lVar42 + 2;
  } while (lVar16 != 4);
  uVar25 = (uint)uVar40;
  lVar26 = *(long *)((long)auStack_58 + (ulong)(uVar25 & 0x18));
  uVar36 = (ulong)((uint)uVar35 & 7);
  lVar42 = 0;
  do {
    uVar12 = *(uint *)(lVar6 + auStack_58[lVar42] * 4);
    uVar11 = uVar8 & uVar12;
    if (((uVar9 == ringbuffer[uVar37 + uVar11]) && (uVar40 != uVar12)) &&
       (uVar28 = uVar40 - uVar12, uVar28 <= uVar21)) {
      if (7 < uVar35) {
        lVar16 = 0;
        uVar32 = 0;
LAB_00103367:
        if (*(ulong *)(piVar2 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar11))
        goto code_r0x00103374;
        uVar29 = *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar11) ^
                 *(ulong *)(piVar2 + uVar32 * 2);
        uVar32 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_001033a8;
      }
      piVar15 = piVar2;
      uVar29 = 0;
LAB_001033ed:
      uVar32 = uVar29;
      if (uVar36 != 0) {
        uVar30 = uVar36 | uVar29;
        uVar31 = uVar36;
        do {
          uVar32 = uVar29;
          if (ringbuffer[uVar29 + uVar11] != (uint8_t)*piVar15) break;
          piVar15 = (int *)((long)piVar15 + 1);
          uVar29 = uVar29 + 1;
          uVar31 = uVar31 - 1;
          uVar32 = uVar30;
        } while (uVar31 != 0);
      }
LAB_001033a8:
      if (3 < uVar32) {
        iVar24 = 0x1f;
        if ((uint)uVar28 != 0) {
          for (; (uint)uVar28 >> iVar24 == 0; iVar24 = iVar24 + -1) {
          }
        }
        uVar29 = (ulong)(iVar24 * -0x1e + 0x780) + uVar32 * 0x87;
        if (local_e8 < uVar29) {
          uVar9 = *(uint8_t *)((long)piVar2 + uVar32);
          uVar37 = uVar32;
          local_e8 = uVar29;
          local_140 = uVar28;
        }
      }
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 4);
  iVar24 = 0;
  if (local_e8 == 0x7e4) {
    lVar42 = *(long *)&(params->hasher).block_bits;
    if (*(ulong *)(lVar42 + 8) >> 7 <= *(ulong *)(lVar42 + 0x10)) {
      uVar21 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12);
      lVar16 = *(long *)(literal_context_lut + 0x78);
      *(ulong *)(lVar42 + 8) = *(ulong *)(lVar42 + 8) + 1;
      bVar22 = *(byte *)(lVar16 + uVar21 * 2);
      uVar14 = (ulong)bVar22;
      if ((uVar14 == 0) || (uVar35 < uVar14)) goto LAB_00103484;
      uVar21 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar21 * 4);
      lVar16 = *(long *)(literal_context_lut + 0x58);
      pcVar18 = (char *)(uVar21 * uVar14 + *(long *)(lVar16 + 0xa8) +
                        (ulong)*(uint *)(lVar16 + 0x20 + uVar14 * 4));
      if (7 < bVar22) {
        uVar36 = (ulong)(bVar22 & 0xfffffff8);
        lVar27 = 0;
        uVar37 = 0;
LAB_00103540:
        if (*(ulong *)(pcVar18 + uVar37 * 8) == *(ulong *)(piVar2 + uVar37 * 2))
        goto code_r0x0010354d;
        uVar36 = *(ulong *)(piVar2 + uVar37 * 2) ^ *(ulong *)(pcVar18 + uVar37 * 8);
        uVar37 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar27;
        goto LAB_0010358e;
      }
      uVar36 = 0;
      goto LAB_001040fe;
    }
    goto LAB_00103484;
  }
  goto LAB_00103624;
code_r0x00103253:
  uVar37 = uVar37 + 1;
  lVar26 = lVar26 + -8;
  if (uVar35 >> 3 == uVar37) goto LAB_001040c2;
  goto LAB_00103242;
code_r0x00103374:
  uVar32 = uVar32 + 1;
  lVar16 = lVar16 + -8;
  piVar15 = (int *)(ringbuffer + (uVar35 & 0xfffffffffffffff8) + uVar14);
  uVar29 = uVar35 & 0xfffffffffffffff8;
  if (uVar35 >> 3 == uVar32) goto LAB_001033ed;
  goto LAB_00103367;
code_r0x0010354d:
  uVar37 = uVar37 + 1;
  lVar27 = lVar27 + -8;
  if (bVar22 >> 3 == uVar37) goto code_r0x00103559;
  goto LAB_00103540;
code_r0x00103559:
  pcVar18 = pcVar18 + -lVar27;
LAB_001040fe:
  uVar28 = uVar14 & 7;
  uVar37 = uVar36;
  if ((bVar22 & 7) != 0) {
    uVar32 = uVar36 | uVar28;
    do {
      uVar37 = uVar36;
      if (*(char *)((long)piVar2 + uVar36) != *pcVar18) break;
      pcVar18 = pcVar18 + 1;
      uVar36 = uVar36 + 1;
      uVar28 = uVar28 - 1;
      uVar37 = uVar32;
    } while (uVar28 != 0);
  }
LAB_0010358e:
  if (((uVar37 == 0) || (*(uint *)(literal_context_lut + 100) + uVar37 <= uVar14)) ||
     (local_140 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                 ((char)(uVar14 - uVar37) * '\x06' & 0x3fU)) & 0x3f) +
                   (uVar14 - uVar37) * 4 << (*(byte *)(lVar16 + uVar14) & 0x3f)) +
                  uVar19 + 1 + uVar21, uVar17 < local_140)) {
LAB_00103484:
    *(uint *)(lVar6 + lVar26 * 4) = uVar25;
  }
  else {
    iVar24 = 0x1f;
    if ((uint)local_140 != 0) {
      for (; (uint)local_140 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    local_e8 = (uVar37 * 0x87 - (ulong)(uint)(iVar24 * 0x1e)) + 0x780;
    if (local_e8 < 0x7e4) goto LAB_00103484;
    iVar24 = (uint)bVar22 - (int)uVar37;
    *(ulong *)(lVar42 + 0x10) = *(ulong *)(lVar42 + 0x10) + 1;
LAB_00103624:
    *(uint *)(lVar6 + lVar26 * 4) = uVar25;
    if (0x7e4 < local_e8) {
      uVar19 = (ulong)*(int *)&(hasher->common).extra;
      uVar14 = (lVar3 + num_bytes) - uVar40;
      iVar13 = 0;
      uVar21 = uVar38;
LAB_0010367d:
      uVar35 = uVar35 - 1;
      uVar36 = uVar37 - 1;
      if (uVar35 <= uVar37 - 1) {
        uVar36 = uVar35;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar36 = 0;
      }
      uVar28 = uVar40 + 1;
      uVar32 = uVar41;
      if (uVar28 < uVar41) {
        uVar32 = uVar28;
      }
      local_118 = lVar5 + uVar40 + 1;
      if (uVar41 <= local_118) {
        local_118 = uVar41;
      }
      piVar2 = (int *)(ringbuffer + (uVar28 & ringbuffer_mask));
      uVar9 = *(uint8_t *)(uVar36 + (long)piVar2);
      uVar31 = uVar28 - uVar19;
      uVar29 = 0x7e4;
      if (uVar28 <= uVar31) {
        local_148 = 0;
        local_150 = 0;
        goto LAB_001037e4;
      }
      uVar25 = (uint)uVar31 & uVar8;
      if (uVar9 == ringbuffer[uVar36 + uVar25]) {
        if (7 < uVar35) {
          lVar26 = 0;
          uVar31 = 0;
LAB_0010372c:
          if (*(ulong *)(piVar2 + uVar31 * 2) == *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar25)
             ) goto code_r0x00103739;
          uVar30 = *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar25) ^
                   *(ulong *)(piVar2 + uVar31 * 2);
          uVar31 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          local_150 = (uVar31 >> 3 & 0x1fffffff) - lVar26;
          goto LAB_00103779;
        }
        local_150 = 0;
        piVar15 = piVar2;
        goto LAB_00103bbb;
      }
      goto LAB_001037bb;
    }
  }
  uVar38 = uVar38 + 1;
  position = uVar40 + 1;
  if ((num_literals == (size_t *)0x0) && (local_100 < position)) {
    if ((uint)((int)lVar34 * 4) + local_100 < position) {
      uVar21 = uVar40 + 0x11;
      if (uVar4 <= uVar40 + 0x11) {
        uVar21 = uVar4;
      }
      for (; position < uVar21; position = position + 4) {
        *(uint *)(lVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                  ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        uVar38 = uVar38 + 4;
      }
    }
    else {
      uVar21 = uVar40 + 9;
      if (uVar4 <= uVar40 + 9) {
        uVar21 = uVar4;
      }
      for (; position < uVar21; position = position + 2) {
        *(uint *)(lVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                  ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        uVar38 = uVar38 + 2;
      }
    }
  }
  goto LAB_00104047;
code_r0x00103739:
  uVar31 = uVar31 + 1;
  lVar26 = lVar26 + -8;
  if (uVar14 >> 3 == uVar31) goto code_r0x00103747;
  goto LAB_0010372c;
code_r0x00103747:
  local_150 = -lVar26;
  piVar15 = (int *)((long)piVar2 - lVar26);
LAB_00103bbb:
  uVar31 = uVar35 & 7;
  for (; (uVar31 != 0 && (ringbuffer[local_150 + uVar25] == (uint8_t)*piVar15));
      local_150 = local_150 + 1) {
    piVar15 = (int *)((long)piVar15 + 1);
    uVar31 = uVar31 - 1;
  }
LAB_00103779:
  if (local_150 < 4) {
    local_148 = 0;
    local_150 = 0;
  }
  else {
    uVar31 = local_150 * 0x87 + 0x78f;
    if (uVar31 < 0x7e5) {
LAB_001037bb:
      local_148 = 0;
      local_150 = 0;
    }
    else {
      uVar9 = *(uint8_t *)((long)piVar2 + local_150);
      uVar36 = local_150;
      uVar29 = uVar31;
      local_148 = uVar19;
    }
  }
LAB_001037e4:
  uVar25 = (uint)((ulong)(*(long *)(ringbuffer + (uVar28 & ringbuffer_mask)) * -0x42e1ca5843000000)
                 >> 0x2f);
  lVar16 = 0;
  lVar26 = 0;
  lVar42 = 1;
  do {
    auStack_58[lVar16] = lVar26 * 8 + (ulong)uVar25 & 0x1ffff;
    auStack_58[lVar16 + 1] = lVar42 * 8 + (ulong)uVar25 & 0x1ffff;
    lVar16 = lVar16 + 2;
    lVar26 = lVar26 + 2;
    lVar42 = lVar42 + 2;
  } while (lVar16 != 4);
  lVar26 = *(long *)((long)auStack_58 + (ulong)((uint)uVar28 & 0x18));
  uVar31 = (ulong)((uint)uVar35 & 7);
  lVar42 = 0;
LAB_0010384f:
  uVar25 = *(uint *)(lVar6 + auStack_58[lVar42] * 4);
  uVar12 = uVar8 & uVar25;
  if (((uVar9 == ringbuffer[uVar36 + uVar12]) && (uVar28 != uVar25)) &&
     (uVar30 = uVar28 - uVar25, uVar30 <= uVar32)) {
    uVar20 = uVar31;
    if (7 < uVar35) {
      lVar16 = 0;
      uVar23 = 0;
LAB_00103897:
      if (*(ulong *)(piVar2 + uVar23 * 2) == *(ulong *)(ringbuffer + uVar23 * 8 + (ulong)uVar12))
      goto code_r0x001038a4;
      uVar23 = *(ulong *)(ringbuffer + uVar23 * 8 + (ulong)uVar12) ^ *(ulong *)(piVar2 + uVar23 * 2)
      ;
      uVar20 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      uVar23 = (uVar20 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_001038ce;
    }
    uVar23 = 0;
    piVar15 = piVar2;
    goto joined_r0x00103936;
  }
  goto LAB_00103919;
code_r0x001038a4:
  uVar23 = uVar23 + 1;
  lVar16 = lVar16 + -8;
  if (uVar14 >> 3 == uVar23) goto code_r0x001038b2;
  goto LAB_00103897;
code_r0x001038b2:
  uVar23 = -lVar16;
  piVar15 = (int *)((long)piVar2 - lVar16);
joined_r0x00103936:
  for (; (uVar20 != 0 && (ringbuffer[uVar23 + uVar12] == (uint8_t)*piVar15)); uVar23 = uVar23 + 1) {
    uVar20 = uVar20 - 1;
    piVar15 = (int *)((long)piVar15 + 1);
  }
LAB_001038ce:
  if (3 < uVar23) {
    iVar39 = 0x1f;
    if ((uint)uVar30 != 0) {
      for (; (uint)uVar30 >> iVar39 == 0; iVar39 = iVar39 + -1) {
      }
    }
    uVar20 = (ulong)(iVar39 * -0x1e + 0x780) + uVar23 * 0x87;
    if (uVar29 < uVar20) {
      uVar9 = *(uint8_t *)((long)piVar2 + uVar23);
      uVar36 = uVar23;
      uVar29 = uVar20;
      local_150 = uVar23;
      local_148 = uVar30;
    }
  }
LAB_00103919:
  lVar42 = lVar42 + 1;
  if (lVar42 == 4) goto LAB_0010394e;
  goto LAB_0010384f;
LAB_0010394e:
  if (uVar29 == 0x7e4) {
    lVar42 = *(long *)&(params->hasher).block_bits;
    uVar29 = 0x7e4;
    if (*(ulong *)(lVar42 + 8) >> 7 <= *(ulong *)(lVar42 + 0x10)) {
      uVar36 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12);
      lVar16 = *(long *)(literal_context_lut + 0x78);
      *(ulong *)(lVar42 + 8) = *(ulong *)(lVar42 + 8) + 1;
      bVar22 = *(byte *)(lVar16 + uVar36 * 2);
      uVar32 = (ulong)bVar22;
      if (uVar32 == 0) goto LAB_00103adb;
      if (uVar32 <= uVar35) {
        uVar36 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar36 * 4);
        lVar16 = *(long *)(literal_context_lut + 0x58);
        pcVar18 = (char *)(uVar36 * uVar32 + *(long *)(lVar16 + 0xa8) +
                          (ulong)*(uint *)(lVar16 + 0x20 + uVar32 * 4));
        if (7 < bVar22) {
          uVar30 = (ulong)(bVar22 & 0xfffffff8);
          lVar27 = 0;
          uVar31 = 0;
LAB_00103a06:
          if (*(ulong *)(pcVar18 + uVar31 * 8) == *(ulong *)(piVar2 + uVar31 * 2))
          goto code_r0x00103a17;
          uVar30 = *(ulong *)(piVar2 + uVar31 * 2) ^ *(ulong *)(pcVar18 + uVar31 * 8);
          uVar31 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar27;
          goto LAB_00103b06;
        }
        uVar30 = 0;
        goto LAB_00103be8;
      }
    }
  }
  iVar39 = 0;
  goto LAB_00103a4e;
code_r0x00103a17:
  uVar31 = uVar31 + 1;
  lVar27 = lVar27 + -8;
  if (bVar22 >> 3 == uVar31) goto code_r0x00103a23;
  goto LAB_00103a06;
code_r0x00103a23:
  pcVar18 = pcVar18 + -lVar27;
LAB_00103be8:
  uVar20 = uVar32 & 7;
  uVar31 = uVar30;
  if ((bVar22 & 7) != 0) {
    uVar23 = uVar30 | uVar20;
    do {
      uVar31 = uVar30;
      if (*(char *)((long)piVar2 + uVar30) != *pcVar18) break;
      pcVar18 = pcVar18 + 1;
      uVar30 = uVar30 + 1;
      uVar20 = uVar20 - 1;
      uVar31 = uVar23;
    } while (uVar20 != 0);
  }
LAB_00103b06:
  iVar39 = 0;
  if ((uVar31 == 0) || (*(uint *)(literal_context_lut + 100) + uVar31 <= uVar32)) goto LAB_00103a4e;
  uVar36 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                          ((char)(uVar32 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
            (uVar32 - uVar31) * 4 << (*(byte *)(lVar16 + uVar32) & 0x3f)) + local_118 + 1 + uVar36;
  if (uVar36 <= uVar17) {
    iVar39 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar39 == 0; iVar39 = iVar39 + -1) {
      }
    }
    uVar32 = (uVar31 * 0x87 - (ulong)(uint)(iVar39 * 0x1e)) + 0x780;
    iVar39 = 0;
    if (0x7e3 < uVar32) {
      iVar39 = (uint)bVar22 - (int)uVar31;
      *(ulong *)(lVar42 + 0x10) = *(ulong *)(lVar42 + 0x10) + 1;
      uVar29 = uVar32;
      local_150 = uVar31;
      local_148 = uVar36;
    }
    goto LAB_00103a4e;
  }
LAB_00103adb:
  iVar39 = 0;
LAB_00103a4e:
  *(uint *)(lVar6 + lVar26 * 4) = (uint)uVar28;
  if (uVar29 < local_e8 + 0xaf) {
    local_150 = uVar37;
    uVar28 = uVar40;
    uVar36 = uVar21;
    local_118 = uVar40 + lVar5;
    iVar39 = iVar24;
    if (uVar41 <= uVar40 + lVar5) {
      local_118 = uVar41;
    }
    goto LAB_00103d4b;
  }
  local_140 = local_148;
  uVar36 = uVar38 + 4;
  if (iVar13 == 3) goto LAB_00103d4b;
  uVar36 = uVar21 + 1;
  iVar13 = iVar13 + 1;
  uVar32 = uVar40 + 9;
  uVar14 = uVar14 - 1;
  uVar37 = local_150;
  uVar40 = uVar28;
  uVar21 = uVar36;
  local_e8 = uVar29;
  iVar24 = iVar39;
  if (uVar1 <= uVar32) goto LAB_00103d4b;
  goto LAB_0010367d;
LAB_00103d4b:
  if (local_118 < local_140) {
LAB_00103d5f:
    uVar40 = local_140 + 0xf;
LAB_00103d63:
    if ((local_140 <= local_118) && (uVar40 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      *(int *)&(hasher->common).extra = (int)local_140;
    }
  }
  else {
    uVar38 = (ulong)*(int *)&(hasher->common).extra;
    if (local_140 != uVar38) {
      uVar21 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar40 = 1;
      if (local_140 != uVar21) {
        uVar38 = (local_140 + 3) - uVar38;
        if (uVar38 < 7) {
          bVar22 = (byte)((int)uVar38 << 2);
          uVar25 = 0x9750468;
        }
        else {
          uVar21 = (local_140 + 3) - uVar21;
          if (6 < uVar21) {
            uVar40 = 2;
            if ((local_140 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar40 = 3,
               local_140 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
            goto LAB_00103d5f;
            goto LAB_00103d63;
          }
          bVar22 = (byte)((int)uVar21 << 2);
          uVar25 = 0xfdb1ace;
        }
        uVar40 = (ulong)(uVar25 >> (bVar22 & 0x1f) & 0xf);
      }
      goto LAB_00103d63;
    }
    uVar40 = 0;
  }
  uVar12 = (uint)uVar36;
  *(uint *)local_128 = uVar12;
  *(uint *)((long)local_128 + 4) = iVar39 << 0x19 | (uint)local_150;
  uVar38 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar25 = 0;
  if (uVar38 <= uVar40) {
    bVar22 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar21 = ((4L << (bVar22 & 0x3f)) + (uVar40 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar25 = 0x1f;
    uVar11 = (uint)uVar21;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar25 = (uVar25 ^ 0xffffffe0) + 0x1f;
    uVar35 = (ulong)((uVar21 >> ((ulong)uVar25 & 0x3f) & 1) != 0);
    lVar26 = (ulong)uVar25 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar40 = (~(-1 << (bVar22 & 0x1f)) & uVar11) + uVar38 +
             (uVar35 + lVar26 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar26 * 0x400;
    uVar25 = (uint)(uVar21 - (uVar35 + 2 << ((byte)uVar25 & 0x3f)) >> (bVar22 & 0x3f));
  }
  *(short *)((long)local_128 + 0xe) = (short)uVar40;
  *(uint *)(local_128 + 1) = uVar25;
  if (5 < uVar36) {
    if (uVar36 < 0x82) {
      uVar25 = 0x1f;
      uVar12 = (uint)(uVar36 - 2);
      if (uVar12 != 0) {
        for (; uVar12 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar12 = (int)(uVar36 - 2 >> ((char)(uVar25 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar25 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar36 < 0x842) {
      uVar25 = 0x1f;
      if (uVar12 - 0x42 != 0) {
        for (; uVar12 - 0x42 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar12 = (uVar25 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar12 = 0x15;
      if (0x1841 < uVar36) {
        uVar12 = (uint)(ushort)(0x17 - (uVar36 < 0x5842));
      }
    }
  }
  uVar25 = iVar39 + (uint)local_150;
  if (uVar25 < 10) {
    uVar11 = uVar25 - 2;
  }
  else if (uVar25 < 0x86) {
    uVar25 = uVar25 - 6;
    uVar11 = 0x1f;
    if (uVar25 != 0) {
      for (; uVar25 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = (uVar25 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar11 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar11 = 0x17;
    if (uVar25 < 0x846) {
      uVar11 = 0x1f;
      if (uVar25 - 0x46 != 0) {
        for (; uVar25 - 0x46 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar11;
  uVar10 = (uVar7 & 7) + ((ushort)uVar12 & 7) * 8;
  if ((((uVar40 & 0x3ff) == 0) && ((ushort)uVar12 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      uVar10 = uVar10 | 0x40;
    }
  }
  else {
    iVar24 = ((uVar12 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
    uVar10 = uVar10 + ((ushort)(0x520d40 >> ((char)iVar24 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar24 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_128 + 0xc) = uVar10;
  *num_commands = *num_commands + uVar36;
  position = local_150 + uVar28;
  uVar38 = sVar33;
  if (position < sVar33) {
    uVar38 = position;
  }
  uVar40 = uVar28 + 2;
  if (local_140 < local_150 >> 2) {
    uVar21 = position + local_140 * -4;
    if (uVar21 < uVar40) {
      uVar21 = uVar40;
    }
    uVar40 = uVar21;
    if (uVar38 < uVar21) {
      uVar40 = uVar38;
    }
  }
  local_100 = uVar28 + lVar34 + local_150 * 2;
  local_128 = local_128 + 2;
  if (uVar40 < uVar38) {
    do {
      *(uint *)(lVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar40 & ringbuffer_mask)) *
                                              -0x42e1ca5843000000) >> 0x2f) + ((uint)uVar40 & 0x18)
                               & 0x1ffff) * 4) = (uint)uVar40;
      uVar40 = uVar40 + 1;
    } while (uVar38 != uVar40);
    uVar38 = 0;
  }
  else {
    uVar38 = 0;
  }
LAB_00104047:
  uVar40 = position;
  if (uVar1 <= position + 8) goto LAB_0010413a;
  goto LAB_001031ac;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}